

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unlzexe.cc
# Opt level: O0

uint32_t unpak_code(output_exe_file *oexe,input *input,uint32_t offset)

{
  uint16_t uVar1;
  uint16_t uVar2;
  long lVar3;
  size_t sz;
  anon_union_4_3_dc327760_for_data local_4560;
  anon_union_4_3_dc327760_for_data local_455c;
  anon_union_4_3_dc327760_for_data local_4558;
  anon_union_4_3_dc327760_for_data local_4554;
  uint8_t local_454d;
  ushort local_454c;
  ushort local_454a;
  uint8_t x;
  int16_t span;
  long lStack_4548;
  int16_t len;
  size_t opos;
  uint8_t *p;
  uint8_t data [17664];
  bit_reader bitstream;
  uint32_t offset_local;
  input *input_local;
  output_exe_file *oexe_local;
  
  (*input->_vptr_input[5])(input,(ulong)offset);
  explode::bit_reader::bit_reader((bit_reader *)(data + 0x44f8),input);
  lStack_4548 = 0;
  local_454a = 0;
  local_454c = 0;
  opos = (size_t)&p;
  do {
    while( true ) {
      while( true ) {
        if (0x3fff < (long)(opos - (long)&p)) {
          (*oexe->_vptr_output_exe_file[3])(oexe,lStack_4548,&p,0x2000);
          lStack_4548 = lStack_4548 + 0x2000;
          opos = opos - 0x2000;
          memmove(&p,data + 0x1ff8,opos - (long)&p);
        }
        uVar1 = explode::bit_reader::bit((bit_reader *)(data + 0x44f8));
        if (uVar1 == 0) break;
        local_4554.r32 = (reg32)explode::byte_reader::byte((byte_reader *)(data + 0x44f8));
        local_454d = explode::register_::operator_cast_to_unsigned_char
                               ((register_ *)&local_4554.r32);
        *(uint8_t *)opos = local_454d;
        opos = opos + 1;
      }
      uVar1 = explode::bit_reader::bit((bit_reader *)(data + 0x44f8));
      if (uVar1 != 0) break;
      uVar1 = explode::bit_reader::bit((bit_reader *)(data + 0x44f8));
      local_454a = uVar1 << 1;
      uVar2 = explode::bit_reader::bit((bit_reader *)(data + 0x44f8));
      local_454a = (uVar1 << 1 | uVar2) + 2;
      local_4558.r32 = (reg32)explode::byte_reader::byte((byte_reader *)(data + 0x44f8));
      uVar1 = explode::register_::operator_cast_to_unsigned_short((register_ *)&local_4558.r32);
      local_454c = uVar1 | 0xff00;
LAB_0011680e:
      for (; 0 < (short)local_454a; local_454a = local_454a + -1) {
        *(undefined1 *)opos = *(undefined1 *)(opos + (long)(int)(short)local_454c);
        opos = opos + 1;
      }
    }
    local_455c.r32 = (reg32)explode::byte_reader::byte((byte_reader *)(data + 0x44f8));
    uVar1 = explode::register_::operator_cast_to_unsigned_short((register_ *)&local_455c.r32);
    local_454c = uVar1 & 0xff;
    local_4560.r32 = (reg32)explode::byte_reader::byte((byte_reader *)(data + 0x44f8));
    uVar1 = explode::register_::operator_cast_to_unsigned_short((register_ *)&local_4560.r32);
    local_454c = local_454c | (uVar1 & 0xf8) << 5 | 0xe000;
    local_454a = (uVar1 & 7) + 2;
    if (local_454a != 2) goto LAB_0011680e;
    sz._4_4_ = (reg32)explode::byte_reader::byte((byte_reader *)(data + 0x44f8));
    uVar1 = explode::register_::operator_cast_to_unsigned_short((register_ *)((long)&sz + 4));
    local_454a = uVar1 & 0xff;
    if (local_454a == 0) {
      if ((uint8_t **)opos != &p) {
        lVar3 = opos - (long)&p;
        (*oexe->_vptr_output_exe_file[3])(oexe,lStack_4548,&p,lVar3);
        lStack_4548 = lVar3 + lStack_4548;
      }
      return (uint32_t)lStack_4548;
    }
    if (local_454a != 1) {
      local_454a = local_454a + 1;
      goto LAB_0011680e;
    }
    local_454a = 1;
  } while( true );
}

Assistant:

static uint32_t unpak_code(explode::output_exe_file& oexe, explode::input& input, uint32_t offset)
{
  input.seek(offset);
  explode::bit_reader bitstream(input);

  uint8_t data[0x4500], *p = data;
  std::size_t opos = 0;
  int16_t len = 0;
  int16_t span = 0;

  while (true)
    {
      if (p - data >= 0x4000)
	{
	  oexe.code_put(opos, data, 0x2000);
	  opos += 0x2000;
	  p -= 0x2000;
	  std::memmove (data, data + 0x2000, static_cast <std::size_t> (p - data));
	}
      if (bitstream.bit())
	{
	  const uint8_t x = bitstream.byte();
	  *p++ = x;
	  continue;
	}

      if (!bitstream.bit())
	{
	  len = static_cast <int16_t>(bitstream.bit() << 1);
	  len = static_cast <int16_t>(len | bitstream.bit());
	  len = static_cast <int16_t>(len + 2);
	  span = static_cast <int16_t>((static_cast <uint16_t>(bitstream.byte()) & 0xFFFF) | 0xFF00);
	}
      else
	{
	  span = static_cast<uint8_t>(static_cast<uint16_t> (bitstream.byte()) & 0xFFFF);
	  len = static_cast <int16_t>(static_cast <uint16_t>(bitstream.byte()) & 0xFF);
	  span = static_cast <int16_t>(span | static_cast<int16_t>(((len & ~0x07) << 5) | 0xe000));
	  len = static_cast<int16_t>((len & 0x07) + 2);
	  if (len == 2)
	    {
	      len = static_cast <int16_t> (static_cast <uint16_t> (bitstream.byte()) & 0xFF);
	      if (len == 0)
		{
		  break;
		}
	      if (len == 1)
		{
		  continue;
		}
	      else
		{
		  len++;
		}
	    }
	}
      for (; len>0; len--, p++)
	{
	  *p = *(p + span);
	}
    }
  if (p != data)
    {
      const std::size_t sz = static_cast <std::size_t> (p-data);
      oexe.code_put(opos, data, sz);
      opos += sz;
    }

  return static_cast <uint32_t> (opos);
}